

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NVT.cpp
# Opt level: O0

void __thiscall OpenMD::NVT::moveB(NVT *this)

{
  RealType RVar1;
  double dVar2;
  bool bVar3;
  long in_RDI;
  pair<double,_double> pVar4;
  int k;
  RealType prevChi;
  RealType oldChi;
  pair<double,_double> thermostat;
  int index;
  RealType instTemp;
  RealType mass;
  Vector3d frc;
  Vector3d vel;
  Vector3d ji;
  Vector3d Tb;
  StuntDouble *sd;
  Molecule *mol;
  IntegrableObjectIterator j;
  MoleculeIterator i;
  pair<double,_double> *in_stack_fffffffffffffdc8;
  Snapshot *in_stack_fffffffffffffdd0;
  StuntDouble *in_stack_fffffffffffffdd8;
  StuntDouble *in_stack_fffffffffffffde0;
  reference in_stack_fffffffffffffde8;
  SimInfo *in_stack_fffffffffffffdf0;
  Rattle *in_stack_fffffffffffffe50;
  StuntDouble *in_stack_fffffffffffffe58;
  int local_f4;
  double local_b0;
  int local_9c;
  Snapshot *local_28;
  Molecule *local_20;
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  local_18;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_10 [2];
  
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(local_10);
  __gnu_cxx::
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  ::__normal_iterator(&local_18);
  Vector3<double>::Vector3((Vector3<double> *)0x21a4b3);
  Vector3<double>::Vector3((Vector3<double> *)0x21a4c0);
  Vector3<double>::Vector3((Vector3<double> *)0x21a4cd);
  Vector3<double>::Vector3((Vector3<double> *)0x21a4da);
  pVar4 = Snapshot::getThermostat(*(Snapshot **)(in_RDI + 0xe0));
  local_9c = 0;
  local_20 = SimInfo::beginMolecule
                       (in_stack_fffffffffffffdf0,(MoleculeIterator *)in_stack_fffffffffffffde8);
  while (local_20 != (Molecule *)0x0) {
    local_28 = (Snapshot *)
               Molecule::beginIntegrableObject
                         ((Molecule *)in_stack_fffffffffffffdf0,
                          (iterator *)in_stack_fffffffffffffde8);
    while (local_28 != (Snapshot *)0x0) {
      StuntDouble::getVel(in_stack_fffffffffffffdd8);
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
                ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                 (in_RDI + 0x118),(long)local_9c);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_fffffffffffffdd0,
                 (Vector3<double> *)in_stack_fffffffffffffdc8);
      bVar3 = StuntDouble::isDirectional((StuntDouble *)in_stack_fffffffffffffdd0);
      if (bVar3) {
        StuntDouble::getJ(in_stack_fffffffffffffdd8);
        std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
                  ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                   (in_RDI + 0x130),(long)local_9c);
        Vector3<double>::operator=
                  ((Vector3<double> *)in_stack_fffffffffffffdd0,
                   (Vector3<double> *)in_stack_fffffffffffffdc8);
      }
      local_9c = local_9c + 1;
      local_28 = (Snapshot *)
                 Molecule::nextIntegrableObject
                           ((Molecule *)in_stack_fffffffffffffdf0,
                            (iterator *)in_stack_fffffffffffffde8);
    }
    local_20 = SimInfo::nextMolecule
                         (in_stack_fffffffffffffdf0,(MoleculeIterator *)in_stack_fffffffffffffde8);
  }
  local_b0 = pVar4.first;
  for (local_f4 = 0; local_f4 < *(int *)(in_RDI + 0xf8); local_f4 = local_f4 + 1) {
    local_9c = 0;
    RVar1 = Thermo::getTemperature((Thermo *)in_stack_fffffffffffffdf0);
    dVar2 = pVar4.first +
            (*(double *)(in_RDI + 0x10) * (RVar1 / *(double *)(in_RDI + 0x100) - 1.0)) /
            (*(double *)(in_RDI + 0x108) * *(double *)(in_RDI + 0x108));
    local_20 = SimInfo::beginMolecule
                         (in_stack_fffffffffffffdf0,(MoleculeIterator *)in_stack_fffffffffffffde8);
    while (local_20 != (Molecule *)0x0) {
      local_28 = (Snapshot *)
                 Molecule::beginIntegrableObject
                           ((Molecule *)in_stack_fffffffffffffdf0,
                            (iterator *)in_stack_fffffffffffffde8);
      while (local_28 != (Snapshot *)0x0) {
        StuntDouble::getFrc(in_stack_fffffffffffffdd8);
        Vector3<double>::operator=
                  ((Vector3<double> *)in_stack_fffffffffffffdd0,
                   (Vector3<double> *)in_stack_fffffffffffffdc8);
        StuntDouble::getMass((StuntDouble *)local_28);
        in_stack_fffffffffffffde8 =
             std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
             operator[]((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                         *)(in_RDI + 0x118),(long)local_9c);
        OpenMD::operator*((double)in_stack_fffffffffffffdd8,
                          (Vector<double,_3U> *)in_stack_fffffffffffffdd0);
        OpenMD::operator+((Vector<double,_3U> *)in_stack_fffffffffffffdd8,
                          (Vector<double,_3U> *)in_stack_fffffffffffffdd0);
        in_stack_fffffffffffffdf0 = (SimInfo *)(*(double *)(in_RDI + 0x10) * dVar2);
        std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
                  ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                   (in_RDI + 0x118),(long)local_9c);
        OpenMD::operator*((double)in_stack_fffffffffffffdd8,
                          (Vector<double,_3U> *)in_stack_fffffffffffffdd0);
        OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffffdd8,
                          (Vector<double,_3U> *)in_stack_fffffffffffffdd0);
        Vector3<double>::operator=
                  ((Vector3<double> *)in_stack_fffffffffffffdd8,
                   (Vector<double,_3U> *)in_stack_fffffffffffffdd0);
        StuntDouble::setVel(in_stack_fffffffffffffde0,(Vector3d *)in_stack_fffffffffffffdd8);
        bVar3 = StuntDouble::isDirectional((StuntDouble *)in_stack_fffffffffffffdd0);
        if (bVar3) {
          StuntDouble::getTrq(in_stack_fffffffffffffdd8);
          StuntDouble::lab2Body(in_stack_fffffffffffffe58,(Vector3d *)in_stack_fffffffffffffe50);
          Vector3<double>::operator=
                    ((Vector3<double> *)local_28,(Vector3<double> *)in_stack_fffffffffffffdc8);
          in_stack_fffffffffffffdd8 =
               (StuntDouble *)
               std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
               operator[]((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           *)(in_RDI + 0x130),(long)local_9c);
          OpenMD::operator*((double)in_stack_fffffffffffffdd8,(Vector<double,_3U> *)local_28);
          OpenMD::operator+((Vector<double,_3U> *)in_stack_fffffffffffffdd8,
                            (Vector<double,_3U> *)local_28);
          in_stack_fffffffffffffde0 = (StuntDouble *)(*(double *)(in_RDI + 0x10) * dVar2);
          std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
          operator[]((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                     (in_RDI + 0x130),(long)local_9c);
          OpenMD::operator*((double)in_stack_fffffffffffffdd8,(Vector<double,_3U> *)local_28);
          OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffffdd8,
                            (Vector<double,_3U> *)local_28);
          Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_fffffffffffffdd8,(Vector<double,_3U> *)local_28);
          StuntDouble::setJ(in_stack_fffffffffffffde0,(Vector3d *)in_stack_fffffffffffffdd8);
          in_stack_fffffffffffffdd0 = local_28;
        }
        local_9c = local_9c + 1;
        local_28 = (Snapshot *)
                   Molecule::nextIntegrableObject
                             ((Molecule *)in_stack_fffffffffffffdf0,
                              (iterator *)in_stack_fffffffffffffde8);
      }
      local_20 = SimInfo::nextMolecule
                           (in_stack_fffffffffffffdf0,(MoleculeIterator *)in_stack_fffffffffffffde8)
      ;
    }
    Rattle::constraintB(in_stack_fffffffffffffe50);
    if (ABS(local_b0 - dVar2) <= *(double *)(in_RDI + 0x110)) break;
    local_b0 = dVar2;
  }
  (**(code **)(**(long **)(in_RDI + 0x90) + 0x30))();
  Snapshot::setThermostat(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  return;
}

Assistant:

void NVT::moveB() {
    SimInfo::MoleculeIterator i;
    Molecule::IntegrableObjectIterator j;
    Molecule* mol;
    StuntDouble* sd;

    Vector3d Tb;
    Vector3d ji;
    Vector3d vel;
    Vector3d frc;
    RealType mass;
    RealType instTemp;
    int index;
    // Set things up for the iteration:

    pair<RealType, RealType> thermostat = snap->getThermostat();
    RealType oldChi                     = thermostat.first;
    RealType prevChi;

    index = 0;
    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (sd = mol->beginIntegrableObject(j); sd != NULL;
           sd = mol->nextIntegrableObject(j)) {
        oldVel_[index] = sd->getVel();

        if (sd->isDirectional()) oldJi_[index] = sd->getJ();

        ++index;
      }
    }

    // do the iteration:

    for (int k = 0; k < maxIterNum_; k++) {
      index    = 0;
      instTemp = thermo.getTemperature();

      // evolve chi another half step using the temperature at t + dt/2

      prevChi          = thermostat.first;
      thermostat.first = oldChi + dt2 * (instTemp / targetTemp_ - 1.0) /
                                      (tauThermostat_ * tauThermostat_);

      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (sd = mol->beginIntegrableObject(j); sd != NULL;
             sd = mol->nextIntegrableObject(j)) {
          frc  = sd->getFrc();
          mass = sd->getMass();

          // velocity half step

          vel = oldVel_[index] + dt2 / mass * Constants::energyConvert * frc -
                dt2 * thermostat.first * oldVel_[index];

          sd->setVel(vel);

          if (sd->isDirectional()) {
            // get and convert the torque to body frame

            Tb = sd->lab2Body(sd->getTrq());

            ji = oldJi_[index] + dt2 * Constants::energyConvert * Tb -
                 dt2 * thermostat.first * oldJi_[index];

            sd->setJ(ji);
          }

          ++index;
        }
      }

      rattle_->constraintB();

      if (fabs(prevChi - thermostat.first) <= chiTolerance_) break;
    }

    flucQ_->moveB();

    thermostat.second += dt2 * thermostat.first;
    snap->setThermostat(thermostat);
  }